

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spxbasis.hpp
# Opt level: O0

double __thiscall
soplex::SPxBasisBase<double>::condition(SPxBasisBase<double> *this,int maxiters,double tolerance)

{
  int iVar1;
  SPxStatus SVar2;
  int in_ESI;
  SPxBasisBase<double> *in_RDI;
  double in_XMM0_Qa;
  Real RVar3;
  SSVectorBase<double> y;
  SSVectorBase<double> x;
  double norm2;
  double norm1;
  double norminv;
  double norm;
  int c;
  int i;
  int miniters;
  int dimension;
  shared_ptr<soplex::Tolerances> *in_stack_fffffffffffffe88;
  SSVectorBase<double> *in_stack_fffffffffffffe90;
  undefined8 in_stack_fffffffffffffe98;
  SSVectorBase<double> *in_stack_fffffffffffffea0;
  SSVectorBase<double> *in_stack_fffffffffffffea8;
  undefined4 in_stack_fffffffffffffeb0;
  undefined4 in_stack_fffffffffffffeb4;
  int iVar4;
  undefined8 in_stack_fffffffffffffeb8;
  int iVar5;
  undefined4 in_stack_fffffffffffffec0;
  SSVectorBase<double> *rhs;
  undefined4 in_stack_fffffffffffffed8;
  undefined4 in_stack_fffffffffffffedc;
  SPxBasisBase<double> *in_stack_fffffffffffffee0;
  undefined1 local_110 [96];
  SSVectorBase<double> local_b0;
  SSVectorBase<double> *local_50;
  SSVectorBase<double> *local_48;
  SSVectorBase<double> *local_40;
  SSVectorBase<double> *local_38;
  int local_30;
  int local_2c;
  int local_28;
  int local_24;
  double local_20;
  int local_14;
  double local_8;
  
  iVar5 = (int)((ulong)in_stack_fffffffffffffeb8 >> 0x20);
  local_20 = in_XMM0_Qa;
  local_14 = in_ESI;
  iVar1 = DataArray<const_soplex::SVectorBase<double>_*>::size(&in_RDI->matrix);
  local_28 = 3;
  if (iVar1 < 1) {
    local_8 = 1.0;
  }
  else {
    local_24 = iVar1;
    SPxSolverBase<double>::tolerances(in_RDI->theLP);
    rhs = &local_b0;
    std::shared_ptr<soplex::Tolerances>::shared_ptr
              ((shared_ptr<soplex::Tolerances> *)in_stack_fffffffffffffe90,in_stack_fffffffffffffe88
              );
    SSVectorBase<double>::SSVectorBase
              ((SSVectorBase<double> *)CONCAT44(iVar1,in_stack_fffffffffffffec0),iVar5,
               (shared_ptr<soplex::Tolerances> *)
               CONCAT44(in_stack_fffffffffffffeb4,in_stack_fffffffffffffeb0));
    std::shared_ptr<soplex::Tolerances>::~shared_ptr((shared_ptr<soplex::Tolerances> *)0x27ecca);
    iVar4 = local_24;
    SPxSolverBase<double>::tolerances(in_RDI->theLP);
    iVar5 = (int)((ulong)&stack0xfffffffffffffee0 >> 0x20);
    std::shared_ptr<soplex::Tolerances>::shared_ptr
              ((shared_ptr<soplex::Tolerances> *)in_stack_fffffffffffffe90,in_stack_fffffffffffffe88
              );
    SSVectorBase<double>::SSVectorBase
              ((SSVectorBase<double> *)CONCAT44(iVar1,in_stack_fffffffffffffec0),iVar5,
               (shared_ptr<soplex::Tolerances> *)CONCAT44(iVar4,in_stack_fffffffffffffeb0));
    std::shared_ptr<soplex::Tolerances>::~shared_ptr((shared_ptr<soplex::Tolerances> *)0x27ed14);
    SVar2 = status(in_RDI);
    if (SVar2 < REGULAR) {
      local_8 = 0.0;
    }
    else {
      if ((in_RDI->matrixIsSetup & 1U) == 0) {
        (*in_RDI->_vptr_SPxBasisBase[5])(in_RDI,&in_RDI->thedesc);
      }
      if ((in_RDI->factorized & 1U) == 0) {
        (*in_RDI->_vptr_SPxBasisBase[0xb])();
      }
      local_48 = (SSVectorBase<double> *)(1.0 / (double)local_24);
      for (local_2c = 0; local_2c < local_24; local_2c = local_2c + 1) {
        SSVectorBase<double>::add
                  (in_stack_fffffffffffffea0,(int)((ulong)in_stack_fffffffffffffe98 >> 0x20),
                   (double)in_stack_fffffffffffffe90);
      }
      SSVectorBase<double>::operator=((SSVectorBase<double> *)in_RDI,rhs);
      for (local_30 = 0; local_30 < local_14; local_30 = local_30 + 1) {
        local_50 = local_48;
        multBaseWith(in_stack_fffffffffffffee0,
                     (SSVectorBase<double> *)
                     CONCAT44(in_stack_fffffffffffffedc,in_stack_fffffffffffffed8),
                     (SSVectorBase<double> *)in_RDI);
        in_stack_fffffffffffffea8 =
             (SSVectorBase<double> *)SSVectorBase<double>::length((SSVectorBase<double> *)0x27eec1);
        local_48 = in_stack_fffffffffffffea8;
        if ((local_28 <= local_30) &&
           (RVar3 = spxAbs<double>((double)in_stack_fffffffffffffea8 - (double)local_50),
           RVar3 < local_20 * (double)local_48)) break;
        multWithBase((SPxBasisBase<double> *)CONCAT44(iVar4,in_stack_fffffffffffffeb0),
                     in_stack_fffffffffffffea8,in_stack_fffffffffffffea0);
        in_stack_fffffffffffffea0 =
             (SSVectorBase<double> *)SSVectorBase<double>::length((SSVectorBase<double> *)0x27ef42);
        local_50 = (SSVectorBase<double> *)(1.0 / (double)in_stack_fffffffffffffea0);
        SSVectorBase<double>::operator*=
                  ((SSVectorBase<double> *)CONCAT44(iVar4,in_stack_fffffffffffffeb0),
                   (double)in_stack_fffffffffffffea8);
      }
      local_38 = local_48;
      SSVectorBase<double>::clear(in_stack_fffffffffffffe90);
      SSVectorBase<double>::clear(in_stack_fffffffffffffe90);
      local_48 = (SSVectorBase<double> *)(1.0 / (double)local_24);
      for (local_2c = 0; local_2c < local_24; local_2c = local_2c + 1) {
        SSVectorBase<double>::add
                  (in_stack_fffffffffffffea0,(int)((ulong)in_stack_fffffffffffffe98 >> 0x20),
                   (double)in_stack_fffffffffffffe90);
      }
      SSVectorBase<double>::operator=((SSVectorBase<double> *)in_RDI,rhs);
      for (local_30 = 0; local_30 < local_14; local_30 = local_30 + 1) {
        local_50 = local_48;
        (*in_RDI->factor->_vptr_SLinSolver[0xd])
                  (in_RDI->factor,&local_b0.super_IdxSet.idx,local_110);
        SSVectorBase<double>::setup(in_stack_fffffffffffffea0);
        local_48 = (SSVectorBase<double> *)
                   SSVectorBase<double>::length((SSVectorBase<double> *)0x27f0b1);
        if ((local_28 <= local_30) &&
           (RVar3 = spxAbs<double>((double)local_48 - (double)local_50),
           RVar3 < local_20 * (double)local_48)) break;
        (*in_RDI->factor->_vptr_SLinSolver[0x15])
                  (in_RDI->factor,local_110,&local_b0.super_IdxSet.idx);
        SSVectorBase<double>::setup(in_stack_fffffffffffffea0);
        in_stack_fffffffffffffe90 =
             (SSVectorBase<double> *)SSVectorBase<double>::length((SSVectorBase<double> *)0x27f149);
        local_50 = (SSVectorBase<double> *)(1.0 / (double)in_stack_fffffffffffffe90);
        SSVectorBase<double>::operator*=
                  ((SSVectorBase<double> *)CONCAT44(iVar4,in_stack_fffffffffffffeb0),
                   (double)in_stack_fffffffffffffea8);
      }
      local_40 = local_48;
      local_8 = (double)local_38 * (double)local_48;
    }
    SSVectorBase<double>::~SSVectorBase(in_stack_fffffffffffffe90);
    SSVectorBase<double>::~SSVectorBase(in_stack_fffffffffffffe90);
  }
  return local_8;
}

Assistant:

R SPxBasisBase<R>::condition(int maxiters, R tolerance)
{
   int dimension = matrix.size();
   int miniters = 3;    // minimum number of power method iterations
   int i;
   int c;
   R norm;
   R norminv;
   R norm1;
   R norm2;

   // catch corner case of empty matrix
   if(dimension <= 0)
      return 1.0;

   SSVectorBase<R> x(dimension, theLP->tolerances());
   SSVectorBase<R> y(dimension, theLP->tolerances());

   // check whether a regular basis matrix is available
   if(status() < REGULAR)
      return 0;

   if(!matrixIsSetup)
      (const_cast<SPxBasisBase<R>*>(this))->loadDesc(thedesc);

   if(!factorized)
      factorize();

   // initialize vectors
   norm1 = 1.0 / (R) dimension;

   for(i = 0; i < dimension; i++)
   {
      // coverity[forward_null]
      x.add(i, norm1);
   }

   y = x;

   // compute norm of B
   for(c = 0; c < maxiters; ++c)
   {
      norm2 = norm1;

      // y = B*x
      multBaseWith(x, y);
      norm1 = y.length();

      // stop if converged
      if(c >= miniters && spxAbs(norm1 - norm2) < tolerance * norm1)
         break;

      // x = B^T*y and normalize
      multWithBase(y, x);
      norm2 = 1.0 / x.length();
      x *= norm2;
   }

   norm = norm1;

   // reinitialize vectors
   x.clear();
   y.clear();
   norm1 = 1.0 / (R) dimension;

   for(i = 0; i < dimension; i++)
      x.add(i, norm1);

   y = x;

   // compute norm of B^-1
   for(c = 0; c < maxiters; ++c)
   {
      norm2 = norm1;

      // x = B^-1*y
      factor->solveRight(x, y);
      x.setup();
      norm1 = x.length();

      // stop if converged
      if(c >= miniters && spxAbs(norm1 - norm2) < tolerance * norm1)
         break;

      // y = B^-T*x and normalize
      factor->solveLeft(y, x);
      y.setup();
      norm2 = 1.0 / y.length();
      y *= norm2;
   }

   norminv = norm1;

   return norm * norminv;
}